

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O3

void __thiscall
summaryindex::indexevents
          (summaryindex *this,string *fullfilename,
          map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          *summaryfileperiod_to_offset,int file_id,
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *eventtoperiods)

{
  int *piVar1;
  iterator iVar2;
  int iVar3;
  FILE *pFVar4;
  size_t sVar5;
  long lVar6;
  vector<long_long,std::allocator<long_long>> *pvVar7;
  char *pcVar8;
  _Base_ptr p_Var9;
  DIR *__dirp;
  dirent *pdVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  uint uVar12;
  undefined4 in_register_0000000c;
  long lVar13;
  long lVar14;
  FILE *pFVar15;
  long lVar16;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *this_00;
  _Base_ptr p_Var17;
  ulong uVar18;
  summaryindex *__s;
  pointer pbVar19;
  _Rb_tree_color _Var20;
  key_type *__k;
  int *piVar21;
  char *this_01;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmVar22;
  summaryindex *this_02;
  summaryindex *psVar23;
  FILE *unaff_R13;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_00;
  longlong offset;
  int summarycalcstream_type;
  summary_period k;
  summarySampleslevelHeader sh;
  int summary_set;
  int samplesize;
  string sStack_11c8;
  value_type vStack_11a8;
  summaryindex *psStack_1188;
  string sStack_1180;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_1160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1158;
  undefined1 auStack_1140 [32];
  _Rb_tree_node_base *p_Stack_1120;
  size_t sStack_1118;
  summaryindex *psStack_1110;
  _Base_ptr p_Stack_1108;
  FILE *pFStack_1100;
  summaryindex *psStack_10f8;
  key_type *pkStack_10e8;
  FILE *pFStack_10e0;
  long lStack_10d8;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_10d0;
  _Base_ptr p_Stack_10c8;
  _Base_ptr p_Stack_10c0;
  key_type kStack_10b8;
  int aiStack_10ac [3];
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  amStack_10a0 [85];
  long lStack_98;
  summaryindex *psStack_90;
  summaryindex *local_68;
  uint local_60;
  uint local_5c;
  key_type local_58;
  int local_4c;
  int local_48;
  long local_40;
  undefined4 local_38;
  undefined1 local_34 [4];
  
  lVar13 = CONCAT44(in_register_0000000c,file_id);
  __k = (key_type *)((ulong)summaryfileperiod_to_offset & 0xffffffff);
  this_01 = "rb";
  lVar14 = lVar13;
  pFVar4 = fopen(*(char **)this,"rb");
  uVar12 = (uint)lVar14;
  if (pFVar4 == (FILE *)0x0) {
    this_02 = this;
    indexevents(this);
  }
  else {
    local_68 = (summaryindex *)0x0;
    local_5c = 0;
    this = (summaryindex *)0x4;
    this_01 = (char *)0x4;
    pFVar15 = pFVar4;
    sVar5 = fread(&local_5c,4,1,pFVar4);
    uVar12 = (uint)pFVar15;
    if (sVar5 != 0) {
      local_68 = (summaryindex *)0x4;
      this = (summaryindex *)0x8;
    }
    this_02 = (summaryindex *)(ulong)(local_5c & 0x3000000);
    if ((local_5c & 0x3000000) == 0x3000000) {
      sVar5 = fread(local_34,4,1,pFVar4);
      if (sVar5 != 0) {
        local_38 = 0;
        local_68 = this;
        sVar5 = fread(&local_38,4,1,pFVar4);
        if (sVar5 != 0) {
          local_68 = this + 4;
          sVar5 = fread(&local_4c,0xc,1,pFVar4);
          if (sVar5 != 0) {
            lVar14 = lVar13 + 8;
            do {
              lVar16 = *(long *)(lVar13 + 0x10);
              lVar6 = lVar14;
              if (lVar16 != 0) {
                do {
                  if (local_4c <= *(int *)(lVar16 + 0x20)) {
                    lVar6 = lVar16;
                  }
                  lVar16 = *(long *)(lVar16 + 0x10 + (ulong)(*(int *)(lVar16 + 0x20) < local_4c) * 8
                                    );
                } while (lVar16 != 0);
                if ((lVar6 != lVar14) && (*(int *)(lVar6 + 0x20) <= local_4c)) {
                  local_58.summary_id = local_48;
                  local_60 = (uint)__k;
                  piVar1 = *(int **)(lVar6 + 0x30);
                  local_58.fileindex = local_60;
                  local_40 = lVar14;
                  for (piVar21 = *(int **)(lVar6 + 0x28); piVar21 != piVar1; piVar21 = piVar21 + 1)
                  {
                    local_58.period_no = *piVar21;
                    pvVar7 = (vector<long_long,std::allocator<long_long>> *)
                             std::
                             map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                             ::operator[]((map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                           *)fullfilename,&local_58);
                    iVar2._M_current = *(longlong **)(pvVar7 + 8);
                    if (iVar2._M_current == *(longlong **)(pvVar7 + 0x10)) {
                      std::vector<long_long,std::allocator<long_long>>::
                      _M_realloc_insert<long_long_const&>(pvVar7,iVar2,(longlong *)&local_68);
                    }
                    else {
                      *iVar2._M_current = (longlong)local_68;
                      *(longlong **)(pvVar7 + 8) = iVar2._M_current + 1;
                    }
                  }
                  __k = (key_type *)(ulong)local_60;
                  lVar14 = local_40;
                }
              }
              local_68 = local_68 + 0xc;
              do {
                sVar5 = fread(&local_58,8,1,pFVar4);
                if (sVar5 == 0) goto LAB_00108775;
                local_68 = local_68 + 8;
              } while (local_58.summary_id != 0);
              sVar5 = fread(&local_4c,0xc,1,pFVar4);
            } while (sVar5 != 0);
          }
        }
      }
LAB_00108775:
      fclose(pFVar4);
      return;
    }
  }
  indexevents(this_02);
  __s = (summaryindex *)(ulong)uVar12;
  pmVar22 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)0x10a3ac;
  pkStack_10e8 = (key_type *)0x1087c9;
  pmStack_10d0 = eventtoperiods;
  lStack_98 = lVar13;
  psStack_90 = this;
  pFStack_10e0 = fopen(*(char **)this_01,"r");
  pFVar4 = unaff_R13;
  if (pFStack_10e0 == (FILE *)0x0) {
LAB_00108951:
    pkStack_10e8 = (key_type *)0x108959;
    indexevents((summaryindex *)this_01);
    unaff_R13 = pFVar4;
  }
  else {
    pmVar22 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)0x10a3ac;
    pkStack_10e8 = (key_type *)0x1087ea;
    p_Stack_10c0 = (_Base_ptr)this_01;
    pFVar4 = fopen(*(char **)this_02,"r");
    if (pFVar4 != (FILE *)0x0) {
      pkStack_10e8 = (key_type *)0x10880d;
      kStack_10b8.fileindex = uVar12;
      pcVar8 = fgets((char *)amStack_10a0,0x1000,pFStack_10e0);
      if (pcVar8 != (char *)0x0) {
        p_Stack_10c8 = &(pmStack_10d0->_M_t)._M_impl.super__Rb_tree_header._M_header;
        __s = (summaryindex *)amStack_10a0;
        __k = &kStack_10b8;
        do {
          pkStack_10e8 = (key_type *)0x10884a;
          iVar3 = __isoc99_sscanf(__s,"%d,%lld",__k,&lStack_10d8);
          if (iVar3 != 2) {
            pmVar22 = amStack_10a0;
            pkStack_10e8 = (key_type *)0x108951;
            indexevents();
            this_02 = __s;
            goto LAB_00108951;
          }
          pkStack_10e8 = (key_type *)0x108862;
          fseek(pFVar4,lStack_10d8,0);
          pkStack_10e8 = (key_type *)0x108879;
          fread(aiStack_10ac,0xc,1,pFVar4);
          p_Var17 = (pmStack_10d0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = p_Stack_10c8;
          if (p_Var17 != (_Base_ptr)0x0) {
            do {
              if (aiStack_10ac[0] <= (int)p_Var17[1]._M_color) {
                p_Var9 = p_Var17;
              }
              p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < aiStack_10ac[0]];
            } while (p_Var17 != (_Base_ptr)0x0);
            if ((p_Var9 != p_Stack_10c8) && ((int)p_Var9[1]._M_color <= aiStack_10ac[0])) {
              this_01 = (char *)p_Var9[1]._M_left;
              for (p_Var17 = p_Var9[1]._M_parent; p_Var17 != (_Base_ptr)this_01;
                  p_Var17 = (_Base_ptr)&p_Var17->field_0x4) {
                kStack_10b8.period_no = p_Var17->_M_color;
                pkStack_10e8 = (key_type *)0x1088f0;
                pvVar7 = (vector<long_long,std::allocator<long_long>> *)
                         std::
                         map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                         ::operator[](this_00,__k);
                iVar2._M_current = *(longlong **)(pvVar7 + 8);
                if (iVar2._M_current == *(longlong **)(pvVar7 + 0x10)) {
                  pkStack_10e8 = (key_type *)0x108919;
                  std::vector<long_long,std::allocator<long_long>>::
                  _M_realloc_insert<long_long_const&>(pvVar7,iVar2,&lStack_10d8);
                }
                else {
                  *iVar2._M_current = lStack_10d8;
                  *(longlong **)(pvVar7 + 8) = iVar2._M_current + 1;
                }
              }
            }
          }
          pkStack_10e8 = (key_type *)0x1088c7;
          pcVar8 = fgets((char *)__s,0x1000,pFStack_10e0);
        } while (pcVar8 != (char *)0x0);
      }
      pkStack_10e8 = (key_type *)0x108928;
      fclose(pFStack_10e0);
      pkStack_10e8 = (key_type *)0x108930;
      fclose(pFVar4);
      return;
    }
  }
  pkStack_10e8 = (key_type *)doit;
  psVar23 = this_02;
  indexevents(this_02);
  vStack_1158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summaryfileperiod_to_offset_00 =
       (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)0x0;
  vStack_1158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_1140._24_8_ = auStack_1140 + 8;
  auStack_1140._8_4_ = _S_red;
  auStack_1140._16_8_ = (_Base_ptr)0x0;
  sStack_1118 = 0;
  psStack_1188 = psVar23;
  pmStack_1160 = pmVar22;
  p_Stack_1120 = (_Rb_tree_node_base *)auStack_1140._24_8_;
  psStack_1110 = __s;
  p_Stack_1108 = (_Base_ptr)this_01;
  pFStack_1100 = unaff_R13;
  psStack_10f8 = this_02;
  pkStack_10e8 = __k;
  __dirp = opendir(*(char **)psVar23);
  if (__dirp == (DIR *)0x0) {
LAB_00108dba:
    doit(psStack_1188);
LAB_00108dc4:
    doit((summaryindex *)&vStack_11a8);
  }
  else {
    while (pdVar10 = readdir(__dirp), pdVar10 != (dirent *)0x0) {
      vStack_11a8._M_dataplus._M_p = (pointer)&vStack_11a8.field_2;
      sVar5 = strlen(pdVar10->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&vStack_11a8,pdVar10->d_name,pdVar10->d_name + sVar5);
      if (4 < vStack_11a8._M_string_length) {
        std::__cxx11::string::substr((ulong)&sStack_11c8,(ulong)&vStack_11a8);
        iVar3 = std::__cxx11::string::compare((char *)&sStack_11c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_11c8._M_dataplus._M_p != &sStack_11c8.field_2) {
          operator_delete(sStack_11c8._M_dataplus._M_p);
        }
        if (iVar3 == 0) {
          sStack_11c8._M_dataplus._M_p = (pointer)&sStack_11c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_11c8,*(long *)psStack_1188,
                     *(long *)(psStack_1188 + 8) + *(long *)psStack_1188);
          std::__cxx11::string::append((char *)&sStack_11c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&vStack_1158,&vStack_11a8);
          sStack_1180._M_dataplus._M_p = (pointer)&sStack_1180.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_1180,sStack_11c8._M_dataplus._M_p,
                     sStack_11c8._M_dataplus._M_p + sStack_11c8._M_string_length);
          uVar18 = sStack_11c8._M_string_length - 4;
          if (sStack_1180._M_string_length < uVar18) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase");
            goto LAB_00108dba;
          }
          sStack_1180._M_dataplus._M_p[uVar18] = '\0';
          sStack_1180._M_string_length = uVar18;
          std::__cxx11::string::append((char *)&sStack_1180);
          pFVar4 = fopen(sStack_1180._M_dataplus._M_p,"r");
          if (pFVar4 == (FILE *)0x0) {
            indexevents((summaryindex *)&sStack_11c8,(string *)auStack_1140,
                        summaryfileperiod_to_offset_00,(int)pmStack_1160,eventtoperiods);
          }
          else {
            fclose(pFVar4);
            eventtoperiods = pmStack_1160;
            indexevents(&sStack_11c8,&sStack_1180,
                        (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                         *)auStack_1140,(int)summaryfileperiod_to_offset_00,pmStack_1160);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_1180._M_dataplus._M_p != &sStack_1180.field_2) {
            operator_delete(sStack_1180._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_11c8._M_dataplus._M_p != &sStack_11c8.field_2) {
            operator_delete(sStack_11c8._M_dataplus._M_p);
          }
          summaryfileperiod_to_offset_00 =
               (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                *)(ulong)((int)summaryfileperiod_to_offset_00 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vStack_11a8._M_dataplus._M_p != &vStack_11a8.field_2) {
        operator_delete(vStack_11a8._M_dataplus._M_p);
      }
    }
    vStack_11a8._M_dataplus._M_p = (pointer)&vStack_11a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vStack_11a8,*(long *)psStack_1188,
               *(long *)(psStack_1188 + 8) + *(long *)psStack_1188);
    std::__cxx11::string::append((char *)&vStack_11a8);
    pFVar4 = fopen(vStack_11a8._M_dataplus._M_p,"wb");
    if (pFVar4 == (FILE *)0x0) goto LAB_00108dc4;
    pbVar19 = vStack_1158.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (vStack_1158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vStack_1158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fprintf(pFVar4,"%s\n",(pbVar19->_M_dataplus)._M_p);
        pbVar19 = pbVar19 + 1;
      } while (pbVar19 !=
               vStack_1158.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar4);
    sStack_11c8._M_dataplus._M_p = (pointer)&sStack_11c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_11c8,*(long *)psStack_1188,
               *(long *)(psStack_1188 + 8) + *(long *)psStack_1188);
    std::__cxx11::string::append((char *)&sStack_11c8);
    std::__cxx11::string::operator=((string *)&vStack_11a8,(string *)&sStack_11c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_11c8._M_dataplus._M_p != &sStack_11c8.field_2) {
      operator_delete(sStack_11c8._M_dataplus._M_p);
    }
    pFVar4 = fopen(vStack_11a8._M_dataplus._M_p,"wb");
    if (pFVar4 != (FILE *)0x0) {
      if ((_Rb_tree_node_base *)auStack_1140._24_8_ == (_Rb_tree_node_base *)(auStack_1140 + 8)) {
        _Var20 = _S_red;
      }
      else {
        _Var20 = _S_red;
        p_Var11 = (_Rb_tree_node_base *)auStack_1140._24_8_;
        do {
          if ((int)_Var20 < (int)p_Var11[1]._M_color) {
            _Var20 = p_Var11[1]._M_color;
          }
          for (p_Var17 = p_Var11[1]._M_left; p_Var17 != p_Var11[1]._M_right;
              p_Var17 = (_Base_ptr)&p_Var17->_M_parent) {
            fprintf(pFVar4,"%d, %d, %d, %lld\n",(ulong)p_Var11[1]._M_color,
                    (ulong)*(uint *)&p_Var11[1].field_0x4,(ulong)*(uint *)&p_Var11[1]._M_parent,
                    *(undefined8 *)p_Var17);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)(auStack_1140 + 8));
      }
      fclose(pFVar4);
      sStack_11c8._M_dataplus._M_p = (pointer)&sStack_11c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_11c8,*(long *)psStack_1188,
                 *(long *)(psStack_1188 + 8) + *(long *)psStack_1188);
      std::__cxx11::string::append((char *)&sStack_11c8);
      std::__cxx11::string::operator=((string *)&vStack_11a8,(string *)&sStack_11c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_11c8._M_dataplus._M_p != &sStack_11c8.field_2) {
        operator_delete(sStack_11c8._M_dataplus._M_p);
      }
      pFVar4 = fopen(vStack_11a8._M_dataplus._M_p,"wb");
      if (pFVar4 != (FILE *)0x0) {
        fprintf(pFVar4,"%d",(ulong)_Var20);
        fclose(pFVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vStack_11a8._M_dataplus._M_p != &vStack_11a8.field_2) {
          operator_delete(vStack_11a8._M_dataplus._M_p);
        }
        std::
        _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)auStack_1140);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_1158);
        return;
      }
      goto LAB_00108dd8;
    }
  }
  doit((summaryindex *)&vStack_11a8);
LAB_00108dd8:
  doit((summaryindex *)&vStack_11a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_11c8._M_dataplus._M_p != &sStack_11c8.field_2) {
    operator_delete(sStack_11c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_11a8._M_dataplus._M_p != &vStack_11a8.field_2) {
    operator_delete(vStack_11a8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)auStack_1140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1158);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void indexevents(const std::string& fullfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {
		FILE* fin = fopen(fullfilename.c_str(), "rb");
		if (fin == NULL) {
			fprintf(stderr, "%s: cannot open %s\n", __func__, fullfilename.c_str());
			exit(EXIT_FAILURE);
		}
		long long offset = 0;
		int summarycalcstream_type = 0;
		size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
		if (i != 0) offset += sizeof(summarycalcstream_type);
		int stream_type = summarycalcstream_type & summarycalc_id;

		if (stream_type != summarycalc_id) {
			fprintf(stderr, "%s: Not a summarycalc stream type %d\n", __func__, stream_type);
			exit(-1);
		}

		stream_type = streamno_mask & summarycalcstream_type;
		int samplesize;
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 0) offset += sizeof(samplesize);
		int summary_set = 0;
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		if (i != 0) offset += sizeof(summary_set);
		summarySampleslevelHeader sh;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			if (i != 0) {
				auto iter = eventtoperiods.find(sh.event_id);
				if (iter != eventtoperiods.end()) {
					summary_period k;
					k.summary_id = sh.summary_id;
					k.fileindex = file_id;
					for (auto period : iter->second) {
						k.period_no = period;
						summaryfileperiod_to_offset[k].push_back(offset);
					}
				}
				offset += sizeof(sh);
			}
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i != 0) offset += sizeof(sr);
				if (i == 0) break;
				if (sr.sidx == 0) break;
			}
		}

		fclose(fin);
	}